

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void acc_stat_one_line(uint8_t *dgd,uint8_t *src,int dgd_stride,int h_start,int h_end,uint8_t avg,
                      int wiener_halfwin,int wiener_win2,int32_t *M_int32,int32_t *H_int32,int count
                      )

{
  byte bVar1;
  ushort uVar2;
  undefined4 in_ECX;
  long lVar3;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  int k;
  int j;
  undefined3 in_stack_00000008;
  int in_stack_00000028;
  int local_a0;
  short asStack_98 [16];
  int idx;
  int16_t X;
  int16_t Y [49];
  int l;
  
  Y[0x29]._1_1_ = in_R9B;
  Y._84_4_ = in_R8D;
  Y._92_4_ = in_EDX;
  unique0x10000126 = in_RSI;
  for (Y._76_4_ = in_ECX; (int)Y._76_4_ < (int)Y._84_4_; Y._76_4_ = Y._76_4_ + 1) {
    bVar1 = *(byte *)(stack0xfffffffffffffff0 + (int)Y._76_4_);
    uVar2 = (ushort)Y[0x29]._1_1_;
    local_a0 = 0;
    for (Y._72_4_ = -_in_stack_00000008; (int)Y._72_4_ <= _in_stack_00000008;
        Y._72_4_ = Y._72_4_ + 1) {
      for (Y._68_4_ = -_in_stack_00000008; (int)Y._68_4_ <= _in_stack_00000008;
          Y._68_4_ = Y._68_4_ + 1) {
        asStack_98[local_a0] =
             (ushort)*(byte *)(in_RDI + ((in_stack_00000028 + Y._68_4_) * Y._92_4_ +
                                        Y._76_4_ + Y._72_4_)) - (ushort)Y[0x29]._1_1_;
        local_a0 = local_a0 + 1;
      }
    }
    Y[0x24] = 0;
    Y[0x25] = 0;
    for (; (int)Y._72_4_ < h_start; Y._72_4_ = Y._72_4_ + 1) {
      *(int *)(src + (long)(int)Y._72_4_ * 4) =
           (int)asStack_98[(int)Y._72_4_] * (int)(short)(bVar1 - uVar2) +
           *(int *)(src + (long)(int)Y._72_4_ * 4);
      Y[0x22] = Y[0x24];
      Y[0x23] = Y[0x25];
      for (; (int)Y._68_4_ < h_start; Y._68_4_ = Y._68_4_ + 1) {
        lVar3 = (long)(Y._72_4_ * h_start + Y._68_4_);
        *(int *)(dgd + lVar3 * 4) =
             (int)asStack_98[(int)Y._72_4_] * (int)asStack_98[(int)Y._68_4_] +
             *(int *)(dgd + lVar3 * 4);
      }
    }
  }
  return;
}

Assistant:

static void acc_stat_one_line(const uint8_t *dgd, const uint8_t *src,
                              int dgd_stride, int h_start, int h_end,
                              uint8_t avg, const int wiener_halfwin,
                              const int wiener_win2, int32_t *M_int32,
                              int32_t *H_int32, int count) {
  int j, k, l;
  int16_t Y[WIENER_WIN2];

  for (j = h_start; j < h_end; j++) {
    const int16_t X = (int16_t)src[j] - (int16_t)avg;
    int idx = 0;
    for (k = -wiener_halfwin; k <= wiener_halfwin; k++) {
      for (l = -wiener_halfwin; l <= wiener_halfwin; l++) {
        Y[idx] =
            (int16_t)dgd[(count + l) * dgd_stride + (j + k)] - (int16_t)avg;
        idx++;
      }
    }
    assert(idx == wiener_win2);
    for (k = 0; k < wiener_win2; ++k) {
      M_int32[k] += (int32_t)Y[k] * X;
      for (l = k; l < wiener_win2; ++l) {
        // H is a symmetric matrix, so we only need to fill out the upper
        // triangle here. We can copy it down to the lower triangle outside
        // the (i, j) loops.
        H_int32[k * wiener_win2 + l] += (int32_t)Y[k] * Y[l];
      }
    }
  }
}